

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O2

int archive_write_disk_set_standard_lookup(archive *a)

{
  void *private_data;
  void *private_data_00;
  
  private_data = calloc(1,0x7f0);
  private_data_00 = calloc(1,0x7f0);
  archive_write_disk_set_group_lookup(a,private_data_00,lookup_gid,cleanup);
  archive_write_disk_set_user_lookup(a,private_data,lookup_uid,cleanup);
  return 0;
}

Assistant:

int
archive_write_disk_set_standard_lookup(struct archive *a)
{
	struct bucket *ucache = malloc(cache_size * sizeof(struct bucket));
	struct bucket *gcache = malloc(cache_size * sizeof(struct bucket));
	memset(ucache, 0, cache_size * sizeof(struct bucket));
	memset(gcache, 0, cache_size * sizeof(struct bucket));
	archive_write_disk_set_group_lookup(a, gcache, lookup_gid, cleanup);
	archive_write_disk_set_user_lookup(a, ucache, lookup_uid, cleanup);
	return (ARCHIVE_OK);
}